

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::cpp::QualifiedFileLevelSymbol
                   (string *__return_storage_ptr__,FileDescriptor *file,string *name,
                   Options *options)

{
  AlphaNum *in_R8;
  string local_c8;
  AlphaNum local_a8;
  pointer local_78;
  size_type sStack_70;
  AlphaNum local_48;
  
  if (*(long *)(*(long *)(file + 8) + 8) == 0) {
    local_78 = "::";
    sStack_70 = 2;
    local_a8.piece_data_ = (name->_M_dataplus)._M_p;
    local_a8.piece_size_ = name->_M_string_length;
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_78,&local_a8,(AlphaNum *)options);
  }
  else {
    Namespace_abi_cxx11_(&local_c8,(cpp *)file,(FileDescriptor *)options,options);
    local_78 = local_c8._M_dataplus._M_p;
    sStack_70 = local_c8._M_string_length;
    local_a8.piece_data_ = "::";
    local_a8.piece_size_ = 2;
    local_48.piece_data_ = (name->_M_dataplus)._M_p;
    local_48.piece_size_ = name->_M_string_length;
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_78,&local_a8,&local_48,in_R8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string QualifiedFileLevelSymbol(const FileDescriptor* file,
                                     const std::string& name,
                                     const Options& options) {
  if (file->package().empty()) {
    return StrCat("::", name);
  }
  return StrCat(Namespace(file, options), "::", name);
}